

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_shift_flags(DisasContext *s,MemOp ot,TCGv_i64 result,TCGv_i64 shm1,TCGv_i64 count,
                    _Bool is_right)

{
  TCGContext *tcg_ctx;
  TCGv_i64 pTVar1;
  TCGv_i32 v2;
  TCGv_i64 c2;
  TCGv_i32 c2_00;
  TCGTemp *ts;
  uintptr_t o_1;
  TCGv_i32 *ppTVar2;
  uintptr_t o_3;
  
  tcg_ctx = s->uc->tcg_ctx;
  c2 = tcg_const_i64_x86_64(tcg_ctx,0);
  pTVar1 = tcg_ctx->cpu_cc_dst;
  if ((0x6800000000002U >> ((ulong)s->cc_op & 0x3f) & 1) == 0) {
    tcg_gen_movcond_i64_x86_64(tcg_ctx,TCG_COND_NE,pTVar1,count,c2,result,pTVar1);
  }
  else if (pTVar1 != result) {
    tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(pTVar1 + (long)tcg_ctx),
                       (TCGArg)(result + (long)tcg_ctx));
  }
  pTVar1 = tcg_ctx->cpu_cc_src;
  if ((0x2000003c00000U >> ((ulong)s->cc_op & 0x3f) & 1) == 0) {
    tcg_gen_movcond_i64_x86_64(tcg_ctx,TCG_COND_NE,pTVar1,count,c2,shm1,pTVar1);
  }
  else if (pTVar1 != shm1) {
    tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(pTVar1 + (long)tcg_ctx),
                       (TCGArg)(shm1 + (long)tcg_ctx));
  }
  tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(s->tmp2_i32 + (long)tcg_ctx),
                     (long)(int)(ot + (uint)is_right * 4 + 0x22));
  if ((long)(int)s->cc_op == 0) {
    ppTVar2 = &tcg_ctx->cpu_cc_op;
  }
  else {
    ppTVar2 = &s->tmp3_i32;
    tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(s->tmp3_i32 + (long)tcg_ctx),
                       (long)(int)s->cc_op);
  }
  v2 = *ppTVar2;
  c2_00 = tcg_const_i32_x86_64(tcg_ctx,0);
  ts = tcg_temp_new_internal_x86_64(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_extrl_i64_i32_x86_64(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),count);
  tcg_gen_movcond_i32_x86_64
            (tcg_ctx,TCG_COND_NE,tcg_ctx->cpu_cc_op,(TCGv_i32)((long)ts - (long)tcg_ctx),c2_00,
             s->tmp2_i32,v2);
  tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(c2_00 + (long)tcg_ctx));
  tcg_temp_free_internal_x86_64(tcg_ctx,ts);
  set_cc_op(s,CC_OP_DYNAMIC);
  return;
}

Assistant:

static void gen_shift_flags(DisasContext *s, MemOp ot, TCGv result,
                            TCGv shm1, TCGv count, bool is_right)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 z32, s32, oldop;
    TCGv z_tl;

    /* Store the results into the CC variables.  If we know that the
       variable must be dead, store unconditionally.  Otherwise we'll
       need to not disrupt the current contents.  */
    z_tl = tcg_const_tl(tcg_ctx, 0);
    if (cc_op_live[s->cc_op] & USES_CC_DST) {
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_cc_dst, count, z_tl,
                           result, tcg_ctx->cpu_cc_dst);
    } else {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_dst, result);
    }
    if (cc_op_live[s->cc_op] & USES_CC_SRC) {
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_cc_src, count, z_tl,
                           shm1, tcg_ctx->cpu_cc_src);
    } else {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src, shm1);
    }
    tcg_temp_free(tcg_ctx, z_tl);

    /* Get the two potential CC_OP values into temporaries.  */
    tcg_gen_movi_i32(tcg_ctx, s->tmp2_i32, (is_right ? CC_OP_SARB : CC_OP_SHLB) + ot);
    if (s->cc_op == CC_OP_DYNAMIC) {
        oldop = tcg_ctx->cpu_cc_op;
    } else {
        tcg_gen_movi_i32(tcg_ctx, s->tmp3_i32, s->cc_op);
        oldop = s->tmp3_i32;
    }

    /* Conditionally store the CC_OP value.  */
    z32 = tcg_const_i32(tcg_ctx, 0);
    s32 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_trunc_tl_i32(tcg_ctx, s32, count);
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_cc_op, s32, z32, s->tmp2_i32, oldop);
    tcg_temp_free_i32(tcg_ctx, z32);
    tcg_temp_free_i32(tcg_ctx, s32);

    /* The CC_OP value is no longer predictable.  */
    set_cc_op(s, CC_OP_DYNAMIC);
}